

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O3

int Timidity::load_connection(ULONG cConnections,CONNECTION *artList,USHORT destination)

{
  int iVar1;
  long lVar2;
  
  if (cConnections != 0) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      if ((((*(USHORT *)((long)&artList->usDestination + lVar2) == destination) &&
           (*(short *)((long)&artList->usSource + lVar2) == 0)) &&
          (*(short *)((long)&artList->usControl + lVar2) == 0)) &&
         (*(short *)((long)&artList->usTransform + lVar2) == 0)) {
        iVar1 = iVar1 + *(int *)((long)&artList->lScale + lVar2);
      }
      lVar2 = lVar2 + 0xc;
    } while ((ulong)cConnections * 0xc != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

static int load_connection(ULONG cConnections, CONNECTION *artList, USHORT destination)
{
	ULONG i;
	int value = 0;
	for (i = 0; i < cConnections; ++i) {
		CONNECTION *conn = &artList[i];
		if(conn->usDestination == destination) {
			// The formula for the destination is:
			// usDestination = usDestination + usTransform(usSource * (usControl * lScale))
			// Since we are only handling source/control of NONE and identity
			// transform, this simplifies to: usDestination = usDestination + lScale
			if (conn->usSource == CONN_SRC_NONE &&
				conn->usControl == CONN_SRC_NONE &&
				conn->usTransform == CONN_TRN_NONE)
				value += conn->lScale;
		}
	}
	return value;
}